

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_image_from_ascii(char *str,int *bytes_read)

{
  double dVar1;
  mat44 R;
  mat44 R_00;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  mat44 *pmVar5;
  bool bVar6;
  float (*in_stack_fffffffffffff5b8) [4];
  int local_9e8;
  undefined1 local_9e0 [8];
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [64];
  undefined1 local_960 [8];
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [64];
  mat44 local_8e0;
  mat44 local_8a0;
  nifti_image *local_860;
  nifti_image *nim;
  int local_850;
  int nn;
  int spos;
  int ii;
  char rhs [1024];
  char lhs [1024];
  int *bytes_read_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    str_local = (char *)0x0;
  }
  else {
    local_850 = 0;
    nn = __isoc99_sscanf(str,"%1023s%n",rhs + 0x3f8,(long)&nim + 4);
    local_850 = nim._4_4_ + local_850;
    if ((nn == 0) || (iVar2 = strcmp(rhs + 0x3f8,"<nifti_image"), iVar2 != 0)) {
      str_local = (char *)0x0;
    }
    else {
      local_860 = (nifti_image *)calloc(1,0x2b8);
      if (local_860 == (nifti_image *)0x0) {
        fprintf(_stderr,"** NIFA: failed to alloc nifti_image\n");
        str_local = (char *)0x0;
      }
      else {
        local_860->nw = 1;
        local_860->nv = 1;
        local_860->nu = 1;
        local_860->nt = 1;
        local_860->nz = 1;
        local_860->ny = 1;
        local_860->nx = 1;
        local_860->dw = 0.0;
        local_860->dv = 0.0;
        local_860->du = 0.0;
        local_860->dt = 0.0;
        local_860->dz = 0.0;
        local_860->dy = 0.0;
        local_860->dx = 0.0;
        local_860->qfac = 1.0;
        iVar2 = nifti_short_order();
        local_860->byteorder = iVar2;
        while( true ) {
          while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)str[local_850]] & 0x2000) != 0) {
            local_850 = local_850 + 1;
          }
          if (str[local_850] == '\0') break;
          nn = __isoc99_sscanf(str + local_850,"%1023s%n",rhs + 0x3f8,(long)&nim + 4);
          local_850 = nim._4_4_ + local_850;
          if ((nn == 0) || (iVar2 = strcmp(rhs + 0x3f8,"/>"), iVar2 == 0)) break;
          while( true ) {
            ppuVar3 = __ctype_b_loc();
            bVar6 = true;
            if (((*ppuVar3)[(int)str[local_850]] & 0x2000) == 0) {
              bVar6 = str[local_850] == '=';
            }
            if (!bVar6) break;
            local_850 = local_850 + 1;
          }
          if (str[local_850] == '\0') break;
          iVar2 = local_850;
          if (str[local_850] == '\'') {
            do {
              nn = iVar2 + 1;
              bVar6 = false;
              if (str[nn] != '\0') {
                bVar6 = str[nn] != '\'';
              }
              iVar2 = nn;
            } while (bVar6);
            nim._4_4_ = (nn - local_850) + -1;
            if (0x3ff < nim._4_4_) {
              nim._4_4_ = 0x3ff;
            }
            memcpy(&spos,str + (long)local_850 + 1,(long)nim._4_4_);
            *(undefined1 *)((long)&spos + (long)nim._4_4_) = 0;
            if (str[nn] == '\'') {
              local_9e8 = nn + 1;
            }
            else {
              local_9e8 = nn;
            }
            local_850 = local_9e8;
          }
          else {
            nn = __isoc99_sscanf(str + local_850,"%1023s%n",&spos,(long)&nim + 4);
            local_850 = nim._4_4_ + local_850;
            if (nn == 0) break;
          }
          unescape_string((char *)&spos);
          iVar2 = strcmp(rhs + 0x3f8,"nifti_type");
          if (iVar2 == 0) {
            iVar2 = strcmp((char *)&spos,"ANALYZE-7.5");
            if (iVar2 == 0) {
              local_860->nifti_type = 0;
            }
            else {
              iVar2 = strcmp((char *)&spos,"NIFTI-1+");
              if (iVar2 == 0) {
                local_860->nifti_type = 1;
              }
              else {
                iVar2 = strcmp((char *)&spos,"NIFTI-1");
                if (iVar2 == 0) {
                  local_860->nifti_type = 2;
                }
                else {
                  iVar2 = strcmp((char *)&spos,"NIFTI-1A");
                  if (iVar2 == 0) {
                    local_860->nifti_type = 3;
                  }
                }
              }
            }
          }
          else {
            iVar2 = strcmp(rhs + 0x3f8,"header_filename");
            if (iVar2 == 0) {
              pcVar4 = nifti_strdup((char *)&spos);
              local_860->fname = pcVar4;
            }
            else {
              iVar2 = strcmp(rhs + 0x3f8,"image_filename");
              if (iVar2 == 0) {
                pcVar4 = nifti_strdup((char *)&spos);
                local_860->iname = pcVar4;
              }
              else {
                iVar2 = strcmp(rhs + 0x3f8,"sto_xyz_matrix");
                if (iVar2 == 0) {
                  in_stack_fffffffffffff5b8 = (local_860->sto_xyz).m + 3;
                  __isoc99_sscanf(&spos,"%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f",
                                  &local_860->sto_xyz,(local_860->sto_xyz).m[0] + 1,
                                  (local_860->sto_xyz).m[0] + 2,(local_860->sto_xyz).m[0] + 3,
                                  (local_860->sto_xyz).m + 1,(int)((local_860->sto_xyz).m[1] + 1),
                                  (local_860->sto_xyz).m[1] + 2,(local_860->sto_xyz).m[1] + 3,
                                  (local_860->sto_xyz).m + 2,(local_860->sto_xyz).m[2] + 1,
                                  (local_860->sto_xyz).m[2] + 2,(local_860->sto_xyz).m[2] + 3,
                                  in_stack_fffffffffffff5b8,(local_860->sto_xyz).m[3] + 1,
                                  (local_860->sto_xyz).m[3] + 2,(local_860->sto_xyz).m[3] + 3);
                }
                else {
                  iVar2 = strcmp(rhs + 0x3f8,"byteorder");
                  if (iVar2 == 0) {
                    iVar2 = strcmp((char *)&spos,"MSB_FIRST");
                    if (iVar2 == 0) {
                      local_860->byteorder = 2;
                    }
                    iVar2 = strcmp((char *)&spos,"LSB_FIRST");
                    if (iVar2 == 0) {
                      local_860->byteorder = 1;
                    }
                  }
                  else {
                    iVar2 = strcmp(rhs + 0x3f8,"image_offset");
                    if (iVar2 == 0) {
                      dVar1 = strtod((char *)&spos,(char **)0x0);
                      local_860->iname_offset = (int)dVar1;
                    }
                    else {
                      iVar2 = strcmp(rhs + 0x3f8,"datatype");
                      if (iVar2 == 0) {
                        dVar1 = strtod((char *)&spos,(char **)0x0);
                        local_860->datatype = (int)(short)(int)dVar1;
                      }
                      else {
                        iVar2 = strcmp(rhs + 0x3f8,"ndim");
                        if (iVar2 == 0) {
                          dVar1 = strtod((char *)&spos,(char **)0x0);
                          local_860->ndim = (int)dVar1;
                        }
                        else {
                          iVar2 = strcmp(rhs + 0x3f8,"nx");
                          if (iVar2 == 0) {
                            dVar1 = strtod((char *)&spos,(char **)0x0);
                            local_860->nx = (int)dVar1;
                          }
                          else {
                            iVar2 = strcmp(rhs + 0x3f8,"ny");
                            if (iVar2 == 0) {
                              dVar1 = strtod((char *)&spos,(char **)0x0);
                              local_860->ny = (int)dVar1;
                            }
                            else {
                              iVar2 = strcmp(rhs + 0x3f8,"nz");
                              if (iVar2 == 0) {
                                dVar1 = strtod((char *)&spos,(char **)0x0);
                                local_860->nz = (int)dVar1;
                              }
                              else {
                                iVar2 = strcmp(rhs + 0x3f8,"nt");
                                if (iVar2 == 0) {
                                  dVar1 = strtod((char *)&spos,(char **)0x0);
                                  local_860->nt = (int)dVar1;
                                }
                                else {
                                  iVar2 = strcmp(rhs + 0x3f8,"nu");
                                  if (iVar2 == 0) {
                                    dVar1 = strtod((char *)&spos,(char **)0x0);
                                    local_860->nu = (int)dVar1;
                                  }
                                  else {
                                    iVar2 = strcmp(rhs + 0x3f8,"nv");
                                    if (iVar2 == 0) {
                                      dVar1 = strtod((char *)&spos,(char **)0x0);
                                      local_860->nv = (int)dVar1;
                                    }
                                    else {
                                      iVar2 = strcmp(rhs + 0x3f8,"nw");
                                      if (iVar2 == 0) {
                                        dVar1 = strtod((char *)&spos,(char **)0x0);
                                        local_860->nw = (int)dVar1;
                                      }
                                      else {
                                        iVar2 = strcmp(rhs + 0x3f8,"dx");
                                        if (iVar2 == 0) {
                                          dVar1 = strtod((char *)&spos,(char **)0x0);
                                          local_860->dx = (float)dVar1;
                                        }
                                        else {
                                          iVar2 = strcmp(rhs + 0x3f8,"dy");
                                          if (iVar2 == 0) {
                                            dVar1 = strtod((char *)&spos,(char **)0x0);
                                            local_860->dy = (float)dVar1;
                                          }
                                          else {
                                            iVar2 = strcmp(rhs + 0x3f8,"dz");
                                            if (iVar2 == 0) {
                                              dVar1 = strtod((char *)&spos,(char **)0x0);
                                              local_860->dz = (float)dVar1;
                                            }
                                            else {
                                              iVar2 = strcmp(rhs + 0x3f8,"dt");
                                              if (iVar2 == 0) {
                                                dVar1 = strtod((char *)&spos,(char **)0x0);
                                                local_860->dt = (float)dVar1;
                                              }
                                              else {
                                                iVar2 = strcmp(rhs + 0x3f8,"du");
                                                if (iVar2 == 0) {
                                                  dVar1 = strtod((char *)&spos,(char **)0x0);
                                                  local_860->du = (float)dVar1;
                                                }
                                                else {
                                                  iVar2 = strcmp(rhs + 0x3f8,"dv");
                                                  if (iVar2 == 0) {
                                                    dVar1 = strtod((char *)&spos,(char **)0x0);
                                                    local_860->dv = (float)dVar1;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(rhs + 0x3f8,"dw");
                                                    if (iVar2 == 0) {
                                                      dVar1 = strtod((char *)&spos,(char **)0x0);
                                                      local_860->dw = (float)dVar1;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(rhs + 0x3f8,"cal_min");
                                                      if (iVar2 == 0) {
                                                        dVar1 = strtod((char *)&spos,(char **)0x0);
                                                        local_860->cal_min = (float)dVar1;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(rhs + 0x3f8,"cal_max");
                                                        if (iVar2 == 0) {
                                                          dVar1 = strtod((char *)&spos,(char **)0x0)
                                                          ;
                                                          local_860->cal_max = (float)dVar1;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(rhs + 0x3f8,"scl_slope");
                                                          if (iVar2 == 0) {
                                                            dVar1 = strtod((char *)&spos,
                                                                           (char **)0x0);
                                                            local_860->scl_slope = (float)dVar1;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(rhs + 0x3f8,"scl_inter");
                                                            if (iVar2 == 0) {
                                                              dVar1 = strtod((char *)&spos,
                                                                             (char **)0x0);
                                                              local_860->scl_inter = (float)dVar1;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(rhs + 0x3f8,
                                                                             "intent_code");
                                                              if (iVar2 == 0) {
                                                                dVar1 = strtod((char *)&spos,
                                                                               (char **)0x0);
                                                                local_860->intent_code =
                                                                     (int)(short)(int)dVar1;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(rhs + 0x3f8,
                                                                               "intent_p1");
                                                                if (iVar2 == 0) {
                                                                  dVar1 = strtod((char *)&spos,
                                                                                 (char **)0x0);
                                                                  local_860->intent_p1 =
                                                                       (float)dVar1;
                                                                }
                                                                else {
                                                                  iVar2 = strcmp(rhs + 0x3f8,
                                                                                 "intent_p2");
                                                                  if (iVar2 == 0) {
                                                                    dVar1 = strtod((char *)&spos,
                                                                                   (char **)0x0);
                                                                    local_860->intent_p2 =
                                                                         (float)dVar1;
                                                                  }
                                                                  else {
                                                                    iVar2 = strcmp(rhs + 0x3f8,
                                                                                   "intent_p3");
                                                                    if (iVar2 == 0) {
                                                                      dVar1 = strtod((char *)&spos,
                                                                                     (char **)0x0);
                                                                      local_860->intent_p3 =
                                                                           (float)dVar1;
                                                                    }
                                                                    else {
                                                                      iVar2 = strcmp(rhs + 0x3f8,
                                                                                     "intent_name");
                                                                      if (iVar2 == 0) {
                                                                        strncpy(local_860->
                                                                                intent_name,
                                                                                (char *)&spos,0xf);
                                                                        local_860->intent_name[0xf]
                                                                             = '\0';
                                                                      }
                                                                      else {
                                                                        iVar2 = strcmp(rhs + 0x3f8,
                                                                                       "toffset");
                                                                        if (iVar2 == 0) {
                                                                          dVar1 = strtod((char *)&
                                                  spos,(char **)0x0);
                                                  local_860->toffset = (float)dVar1;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(rhs + 0x3f8,"xyz_units");
                                                    if (iVar2 == 0) {
                                                      dVar1 = strtod((char *)&spos,(char **)0x0);
                                                      local_860->xyz_units = (int)dVar1;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(rhs + 0x3f8,"time_units");
                                                      if (iVar2 == 0) {
                                                        dVar1 = strtod((char *)&spos,(char **)0x0);
                                                        local_860->time_units = (int)dVar1;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(rhs + 0x3f8,"descrip");
                                                        if (iVar2 == 0) {
                                                          strncpy(local_860->descrip,(char *)&spos,
                                                                  0x4f);
                                                          local_860->descrip[0x4f] = '\0';
                                                        }
                                                        else {
                                                          iVar2 = strcmp(rhs + 0x3f8,"aux_file");
                                                          if (iVar2 == 0) {
                                                            strncpy(local_860->aux_file,
                                                                    (char *)&spos,0x17);
                                                            local_860->aux_file[0x17] = '\0';
                                                          }
                                                          else {
                                                            iVar2 = strcmp(rhs + 0x3f8,"qform_code")
                                                            ;
                                                            if (iVar2 == 0) {
                                                              dVar1 = strtod((char *)&spos,
                                                                             (char **)0x0);
                                                              local_860->qform_code = (int)dVar1;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(rhs + 0x3f8,"quatern_b"
                                                                            );
                                                              if (iVar2 == 0) {
                                                                dVar1 = strtod((char *)&spos,
                                                                               (char **)0x0);
                                                                local_860->quatern_b = (float)dVar1;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(rhs + 0x3f8,
                                                                               "quatern_c");
                                                                if (iVar2 == 0) {
                                                                  dVar1 = strtod((char *)&spos,
                                                                                 (char **)0x0);
                                                                  local_860->quatern_c =
                                                                       (float)dVar1;
                                                                }
                                                                else {
                                                                  iVar2 = strcmp(rhs + 0x3f8,
                                                                                 "quatern_d");
                                                                  if (iVar2 == 0) {
                                                                    dVar1 = strtod((char *)&spos,
                                                                                   (char **)0x0);
                                                                    local_860->quatern_d =
                                                                         (float)dVar1;
                                                                  }
                                                                  else {
                                                                    iVar2 = strcmp(rhs + 0x3f8,
                                                                                   "qoffset_x");
                                                                    if (iVar2 == 0) {
                                                                      dVar1 = strtod((char *)&spos,
                                                                                     (char **)0x0);
                                                                      local_860->qoffset_x =
                                                                           (float)dVar1;
                                                                    }
                                                                    else {
                                                                      iVar2 = strcmp(rhs + 0x3f8,
                                                                                     "qoffset_y");
                                                                      if (iVar2 == 0) {
                                                                        dVar1 = strtod((char *)&spos
                                                                                       ,(char **)0x0
                                                                                      );
                                                                        local_860->qoffset_y =
                                                                             (float)dVar1;
                                                                      }
                                                                      else {
                                                                        iVar2 = strcmp(rhs + 0x3f8,
                                                                                       "qoffset_z");
                                                                        if (iVar2 == 0) {
                                                                          dVar1 = strtod((char *)&
                                                  spos,(char **)0x0);
                                                  local_860->qoffset_z = (float)dVar1;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(rhs + 0x3f8,"qfac");
                                                    if (iVar2 == 0) {
                                                      dVar1 = strtod((char *)&spos,(char **)0x0);
                                                      local_860->qfac = (float)dVar1;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(rhs + 0x3f8,"sform_code");
                                                      if (iVar2 == 0) {
                                                        dVar1 = strtod((char *)&spos,(char **)0x0);
                                                        local_860->sform_code = (int)dVar1;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(rhs + 0x3f8,"freq_dim");
                                                        if (iVar2 == 0) {
                                                          dVar1 = strtod((char *)&spos,(char **)0x0)
                                                          ;
                                                          local_860->freq_dim = (int)dVar1;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(rhs + 0x3f8,"phase_dim");
                                                          if (iVar2 == 0) {
                                                            dVar1 = strtod((char *)&spos,
                                                                           (char **)0x0);
                                                            local_860->phase_dim = (int)dVar1;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(rhs + 0x3f8,"slice_dim");
                                                            if (iVar2 == 0) {
                                                              dVar1 = strtod((char *)&spos,
                                                                             (char **)0x0);
                                                              local_860->slice_dim = (int)dVar1;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(rhs + 0x3f8,
                                                                             "slice_code");
                                                              if (iVar2 == 0) {
                                                                dVar1 = strtod((char *)&spos,
                                                                               (char **)0x0);
                                                                local_860->slice_code = (int)dVar1;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(rhs + 0x3f8,
                                                                               "slice_start");
                                                                if (iVar2 == 0) {
                                                                  dVar1 = strtod((char *)&spos,
                                                                                 (char **)0x0);
                                                                  local_860->slice_start =
                                                                       (int)dVar1;
                                                                }
                                                                else {
                                                                  iVar2 = strcmp(rhs + 0x3f8,
                                                                                 "slice_end");
                                                                  if (iVar2 == 0) {
                                                                    dVar1 = strtod((char *)&spos,
                                                                                   (char **)0x0);
                                                                    local_860->slice_end =
                                                                         (int)dVar1;
                                                                  }
                                                                  else {
                                                                    iVar2 = strcmp(rhs + 0x3f8,
                                                                                   "slice_duration")
                                                                    ;
                                                                    if (iVar2 == 0) {
                                                                      dVar1 = strtod((char *)&spos,
                                                                                     (char **)0x0);
                                                                      local_860->slice_duration =
                                                                           (float)dVar1;
                                                                    }
                                                                    else {
                                                                      iVar2 = strcmp(rhs + 0x3f8,
                                                                                     "num_ext");
                                                                      if (iVar2 == 0) {
                                                                        dVar1 = strtod((char *)&spos
                                                                                       ,(char **)0x0
                                                                                      );
                                                                        local_860->num_ext =
                                                                             (int)dVar1;
                                                                      }
                                                                    }
                                                                  }
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (bytes_read != (int *)0x0) {
          *bytes_read = local_850 + 1;
        }
        if (local_860->ndim < 1) {
          nifti_image_free(local_860);
          str_local = (char *)0x0;
        }
        else {
          nifti_datatype_sizes(local_860->datatype,&local_860->nbyper,&local_860->swapsize);
          if (local_860->nbyper == 0) {
            nifti_image_free(local_860);
            str_local = (char *)0x0;
          }
          else {
            local_860->dim[0] = local_860->ndim;
            local_860->dim[1] = local_860->nx;
            local_860->pixdim[1] = local_860->dx;
            local_860->dim[2] = local_860->ny;
            local_860->pixdim[2] = local_860->dy;
            local_860->dim[3] = local_860->nz;
            local_860->pixdim[3] = local_860->dz;
            local_860->dim[4] = local_860->nt;
            local_860->pixdim[4] = local_860->dt;
            local_860->dim[5] = local_860->nu;
            local_860->pixdim[5] = local_860->du;
            local_860->dim[6] = local_860->nv;
            local_860->pixdim[6] = local_860->dv;
            local_860->dim[7] = local_860->nw;
            local_860->pixdim[7] = local_860->dw;
            local_860->nvox =
                 (long)local_860->nx * (long)local_860->ny * (long)local_860->nz *
                 (long)local_860->nt * (long)local_860->nu * (long)local_860->nv *
                 (long)local_860->nw;
            if (local_860->qform_code < 1) {
              pmVar5 = &local_860->qto_xyz;
              nifti_quatern_to_mat44
                        (&local_8e0,0.0,0.0,0.0,0.0,0.0,0.0,local_860->dx,local_860->dy,
                         local_860->dz,0.0);
              memcpy(pmVar5,&local_8e0,0x40);
            }
            else {
              pmVar5 = &local_860->qto_xyz;
              nifti_quatern_to_mat44
                        (&local_8a0,local_860->quatern_b,local_860->quatern_c,local_860->quatern_d,
                         local_860->qoffset_x,local_860->qoffset_y,local_860->qoffset_z,
                         local_860->dx,local_860->dy,local_860->dz,local_860->qfac);
              memcpy(pmVar5,&local_8a0,0x40);
            }
            pmVar5 = &local_860->qto_ijk;
            memcpy(local_960,&local_860->qto_xyz,0x40);
            R.m[0][2] = (float)(undefined4)local_950;
            R.m[0][3] = (float)local_950._4_4_;
            R.m[0][0] = (float)(undefined4)uStack_958;
            R.m[0][1] = (float)uStack_958._4_4_;
            R.m[1][0] = (float)(undefined4)uStack_948;
            R.m[1][1] = (float)uStack_948._4_4_;
            R.m[1][2] = (float)(undefined4)local_940;
            R.m[1][3] = (float)local_940._4_4_;
            R.m[2][0] = (float)(undefined4)uStack_938;
            R.m[2][1] = (float)uStack_938._4_4_;
            R.m[2][2] = (float)(undefined4)local_930;
            R.m[2][3] = (float)local_930._4_4_;
            R.m[3][0] = (float)(undefined4)uStack_928;
            R.m[3][1] = (float)uStack_928._4_4_;
            R.m[3]._8_8_ = in_stack_fffffffffffff5b8;
            nifti_mat44_inverse(R);
            memcpy(pmVar5,local_920,0x40);
            if (0 < local_860->sform_code) {
              pmVar5 = &local_860->sto_ijk;
              memcpy(local_9e0,&local_860->sto_xyz,0x40);
              R_00.m[0][2] = (float)(undefined4)local_9d0;
              R_00.m[0][3] = (float)local_9d0._4_4_;
              R_00.m[0][0] = (float)(undefined4)uStack_9d8;
              R_00.m[0][1] = (float)uStack_9d8._4_4_;
              R_00.m[1][0] = (float)(undefined4)uStack_9c8;
              R_00.m[1][1] = (float)uStack_9c8._4_4_;
              R_00.m[1][2] = (float)(undefined4)local_9c0;
              R_00.m[1][3] = (float)local_9c0._4_4_;
              R_00.m[2][0] = (float)(undefined4)uStack_9b8;
              R_00.m[2][1] = (float)uStack_9b8._4_4_;
              R_00.m[2][2] = (float)(undefined4)local_9b0;
              R_00.m[2][3] = (float)local_9b0._4_4_;
              R_00.m[3][0] = (float)(undefined4)uStack_9a8;
              R_00.m[3][1] = (float)uStack_9a8._4_4_;
              R_00.m[3]._8_8_ = in_stack_fffffffffffff5b8;
              nifti_mat44_inverse(R_00);
              memcpy(pmVar5,local_9a0,0x40);
            }
            str_local = (char *)local_860;
          }
        }
      }
    }
  }
  return (nifti_image *)str_local;
}

Assistant:

nifti_image *nifti_image_from_ascii( const char *str, int * bytes_read )
{
   char lhs[1024] , rhs[1024] ;
   int ii , spos, nn ;
   nifti_image *nim ;              /* will be output */

   if( str == NULL || *str == '\0' ) return NULL ;  /* bad input!? */

   /* scan for opening string */

   spos = 0 ; 
   ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
   if( ii == 0 || strcmp(lhs,"<nifti_image") != 0 ) return NULL ;

   /* create empty image struct */

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ){
      fprintf(stderr,"** NIFA: failed to alloc nifti_image\n");
      return NULL;
   }

   nim->nx = nim->ny = nim->nz = nim->nt
           = nim->nu = nim->nv = nim->nw = 1 ;
   nim->dx = nim->dy = nim->dz = nim->dt
           = nim->du = nim->dv = nim->dw = 0 ;
   nim->qfac = 1.0f ;

   nim->byteorder = nifti_short_order() ;

   /* starting at str[spos], scan for "equations" of the form
         lhs = 'rhs'
      and assign rhs values into the struct component named by lhs */

   while(1){

     while( isspace((int) str[spos]) ) spos++ ;  /* skip whitespace */
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* get lhs string */

     ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
     if( ii == 0 || strcmp(lhs,"/>") == 0 ) break ;  /* end of input? */

     /* skip whitespace and the '=' marker */

     while( isspace((int) str[spos]) || str[spos] == '=' ) spos++ ;
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* if next character is a quote ', copy everything up to next '
        otherwise, copy everything up to next nonblank              */

     if( str[spos] == '\'' ){
        ii = spos+1 ;
        while( str[ii] != '\0' && str[ii] != '\'' ) ii++ ;
        nn = ii-spos-1 ; if( nn > 1023 ) nn = 1023 ;
        memcpy(rhs,str+spos+1,nn) ; rhs[nn] = '\0' ;
        spos = (str[ii] == '\'') ? ii+1 : ii ;
     } else {
        ii = sscanf( str+spos , "%1023s%n" , rhs , &nn ) ; spos += nn ;
        if( ii == 0 ) break ;  /* nothing found? */
     }
     unescape_string(rhs) ;  /* remove any XML escape sequences */

     /* Now can do the assignment, based on lhs string.
        Start with special cases that don't fit the QNUM/QSTR macros. */

     if( strcmp(lhs,"nifti_type") == 0 ){
            if( strcmp(rhs,"ANALYZE-7.5") == 0 )
               nim->nifti_type = NIFTI_FTYPE_ANALYZE ;
       else if( strcmp(rhs,"NIFTI-1+")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_1 ;
       else if( strcmp(rhs,"NIFTI-1")     == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_2 ;
       else if( strcmp(rhs,"NIFTI-1A")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_ASCII ;
     }
     else if( strcmp(lhs,"header_filename") == 0 ){
       nim->fname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"image_filename") == 0 ){
       nim->iname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"sto_xyz_matrix") == 0 ){
       sscanf( rhs , "%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f" ,
               &(nim->sto_xyz.m[0][0]) , &(nim->sto_xyz.m[0][1]) ,
               &(nim->sto_xyz.m[0][2]) , &(nim->sto_xyz.m[0][3]) ,
               &(nim->sto_xyz.m[1][0]) , &(nim->sto_xyz.m[1][1]) ,
               &(nim->sto_xyz.m[1][2]) , &(nim->sto_xyz.m[1][3]) ,
               &(nim->sto_xyz.m[2][0]) , &(nim->sto_xyz.m[2][1]) ,
               &(nim->sto_xyz.m[2][2]) , &(nim->sto_xyz.m[2][3]) ,
               &(nim->sto_xyz.m[3][0]) , &(nim->sto_xyz.m[3][1]) ,
               &(nim->sto_xyz.m[3][2]) , &(nim->sto_xyz.m[3][3])  ) ;
     }
     else if( strcmp(lhs,"byteorder") == 0 ){
       if( strcmp(rhs,"MSB_FIRST") == 0 ) nim->byteorder = MSB_FIRST ;
       if( strcmp(rhs,"LSB_FIRST") == 0 ) nim->byteorder = LSB_FIRST ;
     }
     else QQNUM(image_offset,iname_offset,int) ;
     else QNUM(datatype,short int) ;
     else QNUM(ndim,int) ;
     else QNUM(nx,int) ;
     else QNUM(ny,int) ;
     else QNUM(nz,int) ;
     else QNUM(nt,int) ;
     else QNUM(nu,int) ;
     else QNUM(nv,int) ;
     else QNUM(nw,int) ;
     else QNUM(dx,float) ;
     else QNUM(dy,float) ;
     else QNUM(dz,float) ;
     else QNUM(dt,float) ;
     else QNUM(du,float) ;
     else QNUM(dv,float) ;
     else QNUM(dw,float) ;
     else QNUM(cal_min,float) ;
     else QNUM(cal_max,float) ;
     else QNUM(scl_slope,float) ;
     else QNUM(scl_inter,float) ;
     else QNUM(intent_code,short) ;
     else QNUM(intent_p1,float) ;
     else QNUM(intent_p2,float) ;
     else QNUM(intent_p3,float) ;
     else QSTR(intent_name,15) ;
     else QNUM(toffset,float) ;
     else QNUM(xyz_units,int) ;
     else QNUM(time_units,int) ;
     else QSTR(descrip,79) ;
     else QSTR(aux_file,23) ;
     else QNUM(qform_code,int) ;
     else QNUM(quatern_b,float) ;
     else QNUM(quatern_c,float) ;
     else QNUM(quatern_d,float) ;
     else QNUM(qoffset_x,float) ;
     else QNUM(qoffset_y,float) ;
     else QNUM(qoffset_z,float) ;
     else QNUM(qfac,float) ;
     else QNUM(sform_code,int) ;
     else QNUM(freq_dim,int) ;
     else QNUM(phase_dim,int) ;
     else QNUM(slice_dim,int) ;
     else QNUM(slice_code,int) ;
     else QNUM(slice_start,int) ;
     else QNUM(slice_end,int) ;
     else QNUM(slice_duration,float) ;
     else QNUM(num_ext,int) ;

   } /* end of while loop */

   if( bytes_read ) *bytes_read = spos+1;         /* "process" last '\n' */

   /* do miscellaneous checking and cleanup */

   if( nim->ndim <= 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nifti_datatype_sizes( nim->datatype, &(nim->nbyper), &(nim->swapsize) );
   if( nim->nbyper == 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nim->dim[0] = nim->ndim ;
   nim->dim[1] = nim->nx ; nim->pixdim[1] = nim->dx ;
   nim->dim[2] = nim->ny ; nim->pixdim[2] = nim->dy ;
   nim->dim[3] = nim->nz ; nim->pixdim[3] = nim->dz ;
   nim->dim[4] = nim->nt ; nim->pixdim[4] = nim->dt ;
   nim->dim[5] = nim->nu ; nim->pixdim[5] = nim->du ;
   nim->dim[6] = nim->nv ; nim->pixdim[6] = nim->dv ;
   nim->dim[7] = nim->nw ; nim->pixdim[7] = nim->dw ;

   nim->nvox = (size_t)nim->nx * nim->ny * nim->nz
                     * nim->nt * nim->nu * nim->nv * nim->nw ;

   if( nim->qform_code > 0 )
     nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;
   else
     nim->qto_xyz = nifti_quatern_to_mat44(
                      0.0f , 0.0f , 0.0f , 0.0f , 0.0f , 0.0f ,
                      nim->dx , nim->dy , nim->dz , 0.0f ) ;


   nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

   if( nim->sform_code > 0 )
     nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

   return nim ;
}